

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_locale.cpp
# Opt level: O1

char * __thiscall
ON_Locale::GetAppleLanguageName(ON_Locale *this,char *buffer,size_t buffer_capacity)

{
  char *string2;
  bool bVar1;
  bool bVar2;
  char *dest;
  char *pcVar3;
  undefined7 extraout_var_00;
  char *source;
  char *pcVar4;
  undefined7 extraout_var;
  
  if (buffer == (char *)0x0 || buffer_capacity == 0) {
    pcVar4 = (char *)0x0;
  }
  else {
    memset(buffer,0,buffer_capacity);
    pcVar4 = buffer + buffer_capacity;
  }
  dest = LocaleStringBuilder('\0',this->m_language_subtag,9,buffer,pcVar4);
  bVar1 = ON_String::EqualOrdinal("zh",3,buffer,3,true);
  string2 = this->m_region_subtag;
  if ((bVar1) || (this->m_region_subtag[0] != '\0')) {
    if (this->m_script_subtag[0] == '\0') {
      bVar1 = ON_String::EqualOrdinal("CN",-1,string2,-1,true);
      pcVar3 = (char *)CONCAT71(extraout_var,bVar1);
      if (bVar1) {
        source = "Hans";
        bVar1 = false;
      }
      else {
        bVar2 = ON_String::EqualOrdinal("TW",-1,string2,-1,true);
        pcVar3 = (char *)CONCAT71(extraout_var_00,bVar2);
        bVar1 = !bVar2;
        source = (char *)0x0;
        if (bVar2) {
          source = "Hant";
        }
      }
      if ((!bVar1) &&
         (dest = LocaleStringBuilder('-',source,5,dest,pcVar4), pcVar3 = dest, dest != (char *)0x0))
      {
        pcVar3 = buffer;
      }
      if (!bVar1) {
        return pcVar3;
      }
    }
    dest = LocaleStringBuilder('-',this->m_script_subtag,5,dest,pcVar4);
  }
  pcVar4 = LocaleStringBuilder('-',string2,5,dest,pcVar4);
  if (pcVar4 == (char *)0x0) {
    buffer = (char *)0x0;
  }
  return buffer;
}

Assistant:

const char* ON_Locale::GetAppleLanguageName(
  char* buffer,
  size_t buffer_capacity
  ) const
{
  char* buffer_end = LocaleStringBuilderDestEnd(buffer,buffer_capacity);
  char* s = buffer;
  s = LocaleStringBuilder(ON_LOCALE_SUBTAG(0,m_language_subtag),s,buffer_end);
  if ( ON_String::EqualOrdinal("zh", 3, buffer, 3, true) || 0 != m_region_subtag[0] )
  {
    // Apple "language" names use "zh-Hans" for "zh-CN" and "zh-Hant" for "zh-TW"
    if ( 0 == m_script_subtag[0] )
    {
      const char* script_subtag = nullptr;
      if ( ON_String::EqualOrdinal("CN", -1, m_region_subtag, -1, true))
        script_subtag = "Hans";
      else if (ON_String::EqualOrdinal("TW", -1, m_region_subtag, -1, true))
        script_subtag = "Hant";
      if (0 != script_subtag)
      {
        s = LocaleStringBuilder('-', script_subtag, 5, s, buffer_end);
        return (nullptr == s) ? nullptr : buffer;
      }
    }
    s = LocaleStringBuilder(ON_LOCALE_SUBTAG('-', m_script_subtag), s, buffer_end);
  }
  s = LocaleStringBuilder(ON_LOCALE_SUBTAG('-', m_region_subtag), s, buffer_end);
  return ( nullptr == s ) ? nullptr : buffer;
}